

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O3

void __thiscall QHttpNetworkConnectionChannel::abort(QHttpNetworkConnectionChannel *this)

{
  SocketState SVar1;
  QAbstractSocket *this_00;
  QLocalSocket *this_01;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 getState;
  anon_class_1_0_00000001 local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(QIODevice **)(this + 0x10) == (QIODevice *)0x0) {
    *(undefined4 *)(this + 0x20) = 0;
    this[0x58] = (QHttpNetworkConnectionChannel)0x0;
  }
  else {
    local_19 = (anon_class_1_0_00000001)0xaa;
    SVar1 = QSocketAbstraction::
            visit<QSocketAbstraction::socketState(QIODevice*)::_lambda(auto:1*)_1_&>
                      (&local_19,*(QIODevice **)(this + 0x10));
    *(uint *)(this + 0x20) = (uint)(SVar1 != UnconnectedState) << 4;
    this[0x58] = (QHttpNetworkConnectionChannel)0x0;
    if (*(long *)(this + 0x10) != 0) {
      this_00 = (QAbstractSocket *)QMetaObject::cast((QObject *)&QAbstractSocket::staticMetaObject);
      if (this_00 == (QAbstractSocket *)0x0) {
        this_01 = (QLocalSocket *)QMetaObject::cast((QObject *)&QLocalSocket::staticMetaObject);
        if (this_01 != (QLocalSocket *)0x0) {
          QLocalSocket::abort(this_01);
        }
      }
      else {
        QAbstractSocket::abort(this_00);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionChannel::abort()
{
    if (!socket)
        state = QHttpNetworkConnectionChannel::IdleState;
    else if (QSocketAbstraction::socketState(socket) == QAbstractSocket::UnconnectedState)
        state = QHttpNetworkConnectionChannel::IdleState;
    else
        state = QHttpNetworkConnectionChannel::ClosingState;

    // pendingEncrypt must only be true in between connected and encrypted states
    pendingEncrypt = false;

    if (socket) {
        // socket can be 0 since the host lookup is done from qhttpnetworkconnection.cpp while
        // there is no socket yet.
        auto callAbort = [](auto *s) {
            s->abort();
        };
        QSocketAbstraction::visit(callAbort, socket);
    }
}